

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLDConfigLDConfigTool.cxx
# Opt level: O3

bool __thiscall
cmLDConfigLDConfigTool::GetLDConfigPaths
          (cmLDConfigLDConfigTool *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *paths)

{
  pointer pcVar1;
  pointer pcVar2;
  cmRuntimeDependencyArchive *pcVar3;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar4;
  cmLDConfigLDConfigTool *pcVar5;
  bool bVar6;
  char cVar7;
  int iVar8;
  cmMakefile *this_00;
  string *psVar9;
  cmUVProcessChainBuilder *this_01;
  istream *piVar10;
  long lVar11;
  long *plVar12;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  string_view arg;
  cmUVProcessChain process;
  vector<const_cmUVProcessChain::Status_*,_std::allocator<const_cmUVProcessChain::Status_*>_> status
  ;
  string line;
  string ldConfigPath;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ldConfigCommand;
  RegularExpressionMatch match;
  cmUVProcessChainBuilder builder;
  undefined1 auStack_198 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_190;
  undefined1 local_170 [17];
  undefined7 uStack_15f;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_150;
  long local_140 [2];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_130;
  cmLDConfigLDConfigTool *local_118;
  vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *local_110;
  undefined1 local_108 [32];
  char *local_e8 [2];
  char local_d8 [16];
  long *local_c8 [2];
  long local_b8;
  char *local_b0;
  undefined1 local_60 [24];
  vector<cmUVProcessChainBuilder::ProcessConfiguration,_std::allocator<cmUVProcessChainBuilder::ProcessConfiguration>_>
  local_48;
  
  local_110 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)paths;
  this_00 = cmRuntimeDependencyArchive::GetMakefile((this->super_cmLDConfigTool).Archive);
  pcVar1 = local_108 + 0x10;
  local_108._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_108,"CMAKE_LDCONFIG_COMMAND","");
  psVar9 = cmMakefile::GetSafeDefinition(this_00,(string *)local_108);
  local_150._M_allocated_capacity = (size_type)local_140;
  pcVar2 = (psVar9->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_150,pcVar2,pcVar2 + psVar9->_M_string_length);
  if ((pointer)local_108._0_8_ != pcVar1) {
    operator_delete((void *)local_108._0_8_,local_108._16_8_ + 1);
  }
  if (local_150._8_8_ == 0) {
    local_108._0_8_ = pcVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_108,"/sbin","");
    local_e8[0] = local_d8;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_e8,"/usr/sbin","");
    plVar12 = &local_b8;
    local_c8[0] = plVar12;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_c8,"/usr/local/sbin","");
    __l._M_len = 3;
    __l._M_array = (iterator)local_108;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)local_170,__l,(allocator_type *)(auStack_198 + 8));
    cmsys::SystemTools::FindProgram
              ((string *)local_60,"ldconfig",
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)local_170,false);
    std::__cxx11::string::operator=((string *)local_150._M_local_buf,(string *)local_60);
    if (local_60._0_8_ != (long)local_60 + 0x10) {
      operator_delete((void *)local_60._0_8_,local_60._16_8_ + 1);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_170);
    lVar11 = -0x60;
    do {
      if (plVar12 != (long *)plVar12[-2]) {
        operator_delete((long *)plVar12[-2],*plVar12 + 1);
      }
      plVar12 = plVar12 + -4;
      lVar11 = lVar11 + 0x20;
    } while (lVar11 != 0);
    if (local_150._8_8_ == 0) {
      pcVar3 = (this->super_cmLDConfigTool).Archive;
      local_108._0_8_ = pcVar1;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_108,"Could not find ldconfig","");
      cmRuntimeDependencyArchive::SetError(pcVar3,(string *)local_108);
      if ((pointer)local_108._0_8_ != pcVar1) {
        operator_delete((void *)local_108._0_8_,local_108._16_8_ + 1);
      }
      bVar6 = false;
      goto LAB_004e9fe0;
    }
  }
  arg._M_str = (char *)local_150._M_allocated_capacity;
  arg._M_len = local_150._8_8_;
  cmExpandedList_abi_cxx11_(&local_130,arg,false);
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<char_const(&)[3]>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_130,
             (char (*) [3])"-v");
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<char_const(&)[3]>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_130,
             (char (*) [3])"-N");
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<char_const(&)[3]>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_130,
             (char (*) [3])"-X");
  cmUVProcessChainBuilder::cmUVProcessChainBuilder((cmUVProcessChainBuilder *)local_60);
  this_01 = cmUVProcessChainBuilder::SetBuiltinStream
                      ((cmUVProcessChainBuilder *)local_60,Stream_OUTPUT);
  cmUVProcessChainBuilder::AddCommand(this_01,&local_130);
  cmUVProcessChainBuilder::Start((cmUVProcessChainBuilder *)auStack_198);
  bVar6 = cmUVProcessChain::Valid((cmUVProcessChain *)auStack_198);
  if (bVar6) {
    local_170._0_8_ = local_170 + 0x10;
    local_170._8_8_ = (pointer)0x0;
    local_170[0x10] = 0;
    local_118 = this;
    if ((GetLDConfigPaths(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&)::
         regex == '\0') &&
       (iVar8 = __cxa_guard_acquire(&GetLDConfigPaths(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&)
                                     ::regex), iVar8 != 0)) {
      GetLDConfigPaths::regex.regmust = (char *)0x0;
      GetLDConfigPaths::regex.program = (char *)0x0;
      GetLDConfigPaths::regex.progsize = 0;
      memset(&GetLDConfigPaths::regex,0,0xaa);
      cmsys::RegularExpression::compile(&GetLDConfigPaths::regex,"^([^\t:]*):");
      __cxa_atexit(cmsys::RegularExpression::~RegularExpression,&GetLDConfigPaths::regex,
                   &__dso_handle);
      __cxa_guard_release(&GetLDConfigPaths(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&)
                           ::regex);
    }
    paVar4 = &local_190.field_2;
    while( true ) {
      piVar10 = cmUVProcessChain::OutputStream((cmUVProcessChain *)auStack_198);
      cVar7 = std::ios::widen((char)*(undefined8 *)(*(long *)piVar10 + -0x18) + (char)piVar10);
      piVar10 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                          (piVar10,(string *)local_170,cVar7);
      if (((byte)piVar10[*(long *)(*(long *)piVar10 + -0x18) + 0x20] & 5) != 0) break;
      memset((RegularExpressionMatch *)local_108,0,0xa8);
      bVar6 = cmsys::RegularExpression::find
                        (&GetLDConfigPaths::regex,(char *)local_170._0_8_,
                         (RegularExpressionMatch *)local_108);
      if (bVar6) {
        local_190._M_dataplus._M_p = (pointer)paVar4;
        if ((char *)local_108._8_8_ == (char *)0x0) {
          local_190._M_string_length._0_4_ = None;
          local_190._M_string_length._4_4_ = 0;
          local_190.field_2._M_local_buf[0] = '\0';
        }
        else {
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)(auStack_198 + 8),local_108._8_8_,local_b0);
        }
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<std::__cxx11::string>
                  (local_110,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   (auStack_198 + 8));
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_190._M_dataplus._M_p != paVar4) {
          operator_delete(local_190._M_dataplus._M_p,
                          CONCAT71(local_190.field_2._M_allocated_capacity._1_7_,
                                   local_190.field_2._M_local_buf[0]) + 1);
        }
      }
    }
    bVar6 = cmUVProcessChain::Wait((cmUVProcessChain *)auStack_198,-1);
    pcVar5 = local_118;
    pcVar1 = local_108 + 0x10;
    if (bVar6) {
      cmUVProcessChain::GetStatus
                ((vector<const_cmUVProcessChain::Status_*,_std::allocator<const_cmUVProcessChain::Status_*>_>
                  *)(auStack_198 + 8),(cmUVProcessChain *)auStack_198);
      if ((*(long **)local_190._M_dataplus._M_p == (long *)0x0) ||
         (**(long **)local_190._M_dataplus._M_p != 0)) {
        pcVar3 = (pcVar5->super_cmLDConfigTool).Archive;
        local_108._0_8_ = pcVar1;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_108,"Failed to run ldconfig","");
        cmRuntimeDependencyArchive::SetError(pcVar3,(string *)local_108);
        if ((pointer)local_108._0_8_ != pcVar1) {
          operator_delete((void *)local_108._0_8_,local_108._16_8_ + 1);
        }
        bVar6 = false;
        if ((StdioConfiguration)local_190._M_dataplus._M_p == (StdioConfiguration)0x0)
        goto LAB_004e9fa5;
      }
      else {
        bVar6 = true;
      }
      operator_delete(local_190._M_dataplus._M_p,
                      CONCAT71(local_190.field_2._M_allocated_capacity._1_7_,
                               local_190.field_2._M_local_buf[0]) - (long)local_190._M_dataplus._M_p
                     );
    }
    else {
      pcVar3 = (local_118->super_cmLDConfigTool).Archive;
      local_108._0_8_ = pcVar1;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_108,"Failed to wait on ldconfig process","");
      cmRuntimeDependencyArchive::SetError(pcVar3,(string *)local_108);
      if ((pointer)local_108._0_8_ != pcVar1) {
        operator_delete((void *)local_108._0_8_,local_108._16_8_ + 1);
      }
      bVar6 = false;
    }
LAB_004e9fa5:
    if ((pointer)local_170._0_8_ != (pointer)(local_170 + 0x10)) {
      operator_delete((void *)local_170._0_8_,CONCAT71(uStack_15f,local_170[0x10]) + 1);
    }
  }
  else {
    pcVar3 = (this->super_cmLDConfigTool).Archive;
    local_108._0_8_ = pcVar1;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_108,"Failed to start ldconfig process","");
    cmRuntimeDependencyArchive::SetError(pcVar3,(string *)local_108);
    if ((pointer)local_108._0_8_ != pcVar1) {
      operator_delete((void *)local_108._0_8_,local_108._16_8_ + 1);
    }
    bVar6 = false;
  }
  cmUVProcessChain::~cmUVProcessChain((cmUVProcessChain *)auStack_198);
  std::
  vector<cmUVProcessChainBuilder::ProcessConfiguration,_std::allocator<cmUVProcessChainBuilder::ProcessConfiguration>_>
  ::~vector(&local_48);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_130);
LAB_004e9fe0:
  if ((long *)local_150._M_allocated_capacity != local_140) {
    operator_delete((void *)local_150._M_allocated_capacity,local_140[0] + 1);
  }
  return bVar6;
}

Assistant:

bool cmLDConfigLDConfigTool::GetLDConfigPaths(std::vector<std::string>& paths)
{
  std::string ldConfigPath =
    this->Archive->GetMakefile()->GetSafeDefinition("CMAKE_LDCONFIG_COMMAND");
  if (ldConfigPath.empty()) {
    ldConfigPath = cmSystemTools::FindProgram(
      "ldconfig", { "/sbin", "/usr/sbin", "/usr/local/sbin" });
    if (ldConfigPath.empty()) {
      this->Archive->SetError("Could not find ldconfig");
      return false;
    }
  }

  std::vector<std::string> ldConfigCommand = cmExpandedList(ldConfigPath);
  ldConfigCommand.emplace_back("-v");
  ldConfigCommand.emplace_back("-N"); // Don't rebuild the cache.
  ldConfigCommand.emplace_back("-X"); // Don't update links.

  cmUVProcessChainBuilder builder;
  builder.SetBuiltinStream(cmUVProcessChainBuilder::Stream_OUTPUT)
    .AddCommand(ldConfigCommand);
  auto process = builder.Start();
  if (!process.Valid()) {
    this->Archive->SetError("Failed to start ldconfig process");
    return false;
  }

  std::string line;
  static const cmsys::RegularExpression regex("^([^\t:]*):");
  while (std::getline(*process.OutputStream(), line)) {
    cmsys::RegularExpressionMatch match;
    if (regex.find(line.c_str(), match)) {
      paths.push_back(match.match(1));
    }
  }

  if (!process.Wait()) {
    this->Archive->SetError("Failed to wait on ldconfig process");
    return false;
  }
  auto status = process.GetStatus();
  if (!status[0] || status[0]->ExitStatus != 0) {
    this->Archive->SetError("Failed to run ldconfig");
    return false;
  }

  return true;
}